

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Expressions.cpp
# Opt level: O1

bool __thiscall
psy::C::Parser::parsePostfixExpression_AtFollowOfPrimary<psy::C::CallExpressionSyntax>
          (Parser *this,ExpressionSyntax **expr,SyntaxKind exprK,
          function<bool_(psy::C::CallExpressionSyntax_*&)> *parsePostfix)

{
  bool bVar1;
  SyntaxToken *pSVar2;
  ostream *poVar3;
  CallExpressionSyntax *postfixExpr;
  SyntaxKind local_22;
  CallExpressionSyntax *local_20;
  
  local_22 = exprK;
  pSVar2 = peek(this,1);
  if ((((pSVar2->syntaxK_ != OpenBracketToken) &&
       (pSVar2 = peek(this,1), pSVar2->syntaxK_ != OpenParenToken)) &&
      (pSVar2 = peek(this,1), pSVar2->syntaxK_ != DotToken)) &&
     (((pSVar2 = peek(this,1), pSVar2->syntaxK_ != ArrowToken &&
       (pSVar2 = peek(this,1), pSVar2->syntaxK_ != PlusPlusToken)) &&
      (pSVar2 = peek(this,1), pSVar2->syntaxK_ != MinusMinusToken)))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Expressions.cpp"
               ,99);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2af);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"assert failure: `[\', `(\', `.\', `->\', \'++\', or `--\'",0x32);
    std::endl<char,std::char_traits<char>>(poVar3);
    return false;
  }
  local_20 = makeNode<psy::C::CallExpressionSyntax,psy::C::SyntaxKind&>(this,&local_22);
  local_20->expr_ = *expr;
  *expr = &local_20->super_ExpressionSyntax;
  if ((parsePostfix->super__Function_base)._M_manager != (_Manager_type)0x0) {
    bVar1 = (*parsePostfix->_M_invoker)((_Any_data *)parsePostfix,&local_20);
    return bVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

bool Parser::parsePostfixExpression_AtFollowOfPrimary(
        ExpressionSyntax*& expr,
        SyntaxKind exprK,
        std::function<bool(ExprT*&)> parsePostfix)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(peek().kind() == SyntaxKind::OpenBracketToken
                        || peek().kind() == SyntaxKind::OpenParenToken
                        || peek().kind() == SyntaxKind::DotToken
                        || peek().kind() == SyntaxKind::ArrowToken
                        || peek().kind() == SyntaxKind::PlusPlusToken
                        || peek().kind() == SyntaxKind::MinusMinusToken,
                  return false,
                  "assert failure: `[', `(', `.', `->', '++', or `--'");

    auto postfixExpr = makeNode<ExprT>(exprK);
    postfixExpr->expr_ = expr;
    expr = postfixExpr;
    return parsePostfix(postfixExpr);
}